

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O3

int mapEndBiome(EndNoise *en,int *out,int x,int z,int w,int h)

{
  long lVar1;
  long lVar2;
  double dVar3;
  uint uVar4;
  short sVar5;
  uint uVar6;
  void *__ptr;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  void *pvVar16;
  ushort *puVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  long local_a8;
  long local_a0;
  ulong local_98;
  
  lVar18 = (long)(w + 0x1a);
  __ptr = malloc(lVar18 * (h + 0x1a) * 2);
  if (-0x1a < h) {
    lVar7 = (long)x;
    lVar11 = (long)z;
    lVar8 = (long)w;
    local_a0 = 0;
    pvVar16 = __ptr;
    do {
      if (-0x1a < w) {
        lVar1 = lVar11 + -0xc + local_a0;
        lVar22 = 0;
        do {
          lVar13 = lVar7 + -0xc + lVar22;
          if (((ulong)(lVar13 * lVar13 + lVar1 * lVar1) < 0x1001) ||
             (dVar3 = sampleSimplex2D(&en->perlin,(double)lVar13,(double)lVar1),
             -0.8999999761581421 <= dVar3)) {
            sVar5 = 0;
          }
          else {
            uVar9 = (ulong)(ABS((float)lVar13) * 3439.0 + ABS((float)lVar1) * 147.0);
            uVar12 = uVar9 & 0xffffffff;
            sVar5 = ((short)uVar9 - ((short)(uVar12 / 0xd) + (short)(uVar12 / 0xd) * 0xc)) + 9;
            sVar5 = sVar5 * sVar5;
          }
          *(short *)((long)pvVar16 + lVar22 * 2) = sVar5;
          lVar22 = lVar22 + 1;
        } while (lVar18 != lVar22);
      }
      local_a0 = local_a0 + 1;
      pvVar16 = (void *)((long)pvVar16 + lVar8 * 2 + 0x34);
    } while (local_a0 != h + 0x1a);
    if (0 < h) {
      local_98 = lVar11 * 2;
      local_a8 = 0;
      do {
        if (0 < w) {
          lVar1 = local_a8 + lVar11;
          uVar4 = (int)lVar1 * 2 + 1;
          local_a0._0_4_ = uVar4 * uVar4;
          uVar6 = -uVar4;
          if (0 < (int)uVar4) {
            uVar6 = uVar4;
          }
          lVar22 = 0;
          do {
            lVar13 = lVar22 + lVar7;
            iVar10 = 9;
            if (0x1000 < (ulong)(lVar13 * lVar13 + lVar1 * lVar1)) {
              lVar2 = lVar13 * 2 + 1;
              uVar19 = (uint)lVar2;
              if ((en->mc < 0x11) || (iVar10 = 0x2b, -1 < (int)(uVar19 * uVar19 + (int)local_a0))) {
                uVar9 = (ulong)((uint)((int)lVar13 * 2) >> 0x1f);
                uVar14 = -uVar19;
                if (0 < (int)uVar19) {
                  uVar14 = uVar19;
                }
                uVar19 = (uVar19 * uVar19 + uVar4 * uVar4) * 0x40;
                if (0xf < uVar6) {
                  uVar19 = 0x3841;
                }
                if (0xf < uVar14) {
                  uVar19 = 0x3841;
                }
                puVar17 = (ushort *)
                          ((long)__ptr +
                          (lVar2 - (lVar2 >> 0x3f) & 0xfffffffffffffffeU) +
                          (((lVar1 * 2 - (lVar1 * 2 >> 0x3f)) + 1 >> 1) - lVar11) * lVar18 * 2 +
                          lVar7 * -2 + 0x30);
                lVar13 = 0;
                do {
                  uVar20 = (uint)*(ushort *)
                                  (&DAT_00187760 +
                                  (ulong)((uint)(local_98 >> 0x1e) & 2) + lVar13 * 2);
                  uVar14 = uVar19;
                  if ((puVar17[-0x18] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_00187760 + uVar9 * 2) + uVar20) *
                               (uint)puVar17[-0x18], uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar19 = uVar14;
                  if ((puVar17[-0x17] != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_00187762 + uVar9 * 2) + uVar20) *
                               (uint)puVar17[-0x17], uVar14 <= uVar19)) {
                    uVar19 = uVar14;
                  }
                  uVar14 = uVar19;
                  if ((puVar17[-0x16] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_00187764 + uVar9 * 2) + uVar20) *
                               (uint)puVar17[-0x16], uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar19 = uVar14;
                  if ((puVar17[-0x15] != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_00187766 + uVar9 * 2) + uVar20) *
                               (uint)puVar17[-0x15], uVar14 <= uVar19)) {
                    uVar19 = uVar14;
                  }
                  uVar14 = uVar19;
                  if ((puVar17[-0x14] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_00187768 + uVar9 * 2) + uVar20) *
                               (uint)puVar17[-0x14], uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar19 = uVar14;
                  if ((puVar17[-0x13] != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_0018776a + uVar9 * 2) + uVar20) *
                               (uint)puVar17[-0x13], uVar14 <= uVar19)) {
                    uVar19 = uVar14;
                  }
                  uVar14 = uVar19;
                  if ((puVar17[-0x12] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_0018776c + uVar9 * 2) + uVar20) *
                               (uint)puVar17[-0x12], uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar19 = uVar14;
                  if ((puVar17[-0x11] != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_0018776e + uVar9 * 2) + uVar20) *
                               (uint)puVar17[-0x11], uVar14 <= uVar19)) {
                    uVar19 = uVar14;
                  }
                  uVar21 = (uint)*(ushort *)
                                  (&DAT_00187760 +
                                  (ulong)((uint)(local_98 >> 0x1e) & 2) + lVar13 * 2);
                  uVar14 = uVar19;
                  if ((puVar17[-0x10] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_00187770 + uVar9 * 2) + uVar21) *
                               (uint)puVar17[-0x10], uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar19 = uVar14;
                  if ((puVar17[-0xf] != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_00187772 + uVar9 * 2) + uVar21) *
                               (uint)puVar17[-0xf], uVar14 <= uVar19)) {
                    uVar19 = uVar14;
                  }
                  uVar14 = uVar19;
                  if ((puVar17[-0xe] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_00187774 + uVar9 * 2) + uVar21) *
                               (uint)puVar17[-0xe], uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar19 = uVar14;
                  if ((puVar17[-0xd] != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_00187776 + uVar9 * 2) + uVar21) *
                               (uint)puVar17[-0xd], uVar14 <= uVar19)) {
                    uVar19 = uVar14;
                  }
                  uVar14 = uVar19;
                  if ((puVar17[-0xc] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_00187778 + uVar9 * 2) + uVar21) *
                               (uint)puVar17[-0xc], uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar19 = uVar14;
                  if ((puVar17[-0xb] != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_0018777a + uVar9 * 2) + uVar21) *
                               (uint)puVar17[-0xb], uVar14 <= uVar19)) {
                    uVar19 = uVar14;
                  }
                  uVar14 = uVar19;
                  if ((puVar17[-10] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_0018777c + uVar9 * 2) + uVar21) *
                               (uint)puVar17[-10], uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar19 = uVar14;
                  if ((puVar17[-9] != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_0018777e + uVar9 * 2) + uVar21) * (uint)puVar17[-9]
                     , uVar14 <= uVar19)) {
                    uVar19 = uVar14;
                  }
                  uVar14 = uVar19;
                  if ((puVar17[-8] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_00187780 + uVar9 * 2) + uVar21) * (uint)puVar17[-8]
                     , uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar19 = uVar14;
                  if ((puVar17[-7] != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_00187782 + uVar9 * 2) + uVar21) * (uint)puVar17[-7]
                     , uVar14 <= uVar19)) {
                    uVar19 = uVar14;
                  }
                  uVar14 = uVar19;
                  if ((puVar17[-6] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_00187784 + uVar9 * 2) + uVar21) * (uint)puVar17[-6]
                     , uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar19 = uVar14;
                  if ((puVar17[-5] != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_00187786 + uVar9 * 2) + uVar21) * (uint)puVar17[-5]
                     , uVar14 <= uVar19)) {
                    uVar19 = uVar14;
                  }
                  uVar14 = uVar19;
                  if ((puVar17[-4] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_00187788 + uVar9 * 2) + uVar21) * (uint)puVar17[-4]
                     , uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar19 = uVar14;
                  if ((puVar17[-3] != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_0018778a + uVar9 * 2) + uVar21) * (uint)puVar17[-3]
                     , uVar14 <= uVar19)) {
                    uVar19 = uVar14;
                  }
                  uVar14 = uVar19;
                  if ((puVar17[-2] != 0) &&
                     (uVar14 = (*(ushort *)(&DAT_0018778c + uVar9 * 2) + uVar21) * (uint)puVar17[-2]
                     , uVar19 <= uVar14)) {
                    uVar14 = uVar19;
                  }
                  uVar15 = uVar14;
                  if ((puVar17[-1] != 0) &&
                     (uVar15 = (*(ushort *)(&DAT_0018778e + uVar9 * 2) + uVar21) * (uint)puVar17[-1]
                     , uVar14 <= uVar15)) {
                    uVar15 = uVar14;
                  }
                  uVar19 = uVar15;
                  if ((*puVar17 != 0) &&
                     (uVar19 = (*(ushort *)(&DAT_00187790 + uVar9 * 2) + uVar20) * (uint)*puVar17,
                     uVar15 <= uVar19)) {
                    uVar19 = uVar15;
                  }
                  lVar13 = lVar13 + 1;
                  puVar17 = puVar17 + lVar8 + 0x1a;
                } while (lVar13 != 0x19);
                iVar10 = 0x2a;
                if ((0xe0f < uVar19) && (iVar10 = 0x29, 10000 < uVar19)) {
                  iVar10 = (uint)(uVar19 < 0x3841) * 3 + 0x28;
                }
              }
            }
            out[local_a8 * lVar8 + lVar22] = iVar10;
            lVar22 = lVar22 + 1;
          } while (lVar22 != lVar8);
        }
        local_a8 = local_a8 + 1;
        local_98 = local_98 + 2;
      } while (local_a8 != h);
    }
  }
  free(__ptr);
  return 0;
}

Assistant:

int mapEndBiome(const EndNoise *en, int *out, int x, int z, int w, int h)
{
    int64_t i, j;
    int64_t hw = w + 26;
    int64_t hh = h + 26;
    uint16_t *hmap = (uint16_t*) malloc(sizeof(*hmap) * hw * hh);

    for (j = 0; j < hh; j++)
    {
        for (i = 0; i < hw; i++)
        {
            int64_t rx = x + i - 12;
            int64_t rz = z + j - 12;
            uint64_t rsq = rx * rx + rz * rz;
            uint16_t v = 0;
            if (rsq > 4096 && sampleSimplex2D(&en->perlin, rx, rz) < -0.9f)
            {
                //v = (llabs(rx) * 3439 + llabs(rz) * 147) % 13 + 9;
                v = (unsigned int)(
                        fabsf((float)rx) * 3439.0f + fabsf((float)rz) * 147.0f
                    ) % 13 + 9;
                v *= v;
            }
            hmap[(int64_t)j*hw+i] = v;
        }
    }

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int64_t hx = (i+x);
            int64_t hz = (j+z);
            uint64_t rsq = hx * hx + hz * hz;

            if (rsq <= 4096L)
                out[j*w+i] = the_end;
            else
            {
                hx = 2*hx + 1;
                hz = 2*hz + 1;
                if (en->mc > MC_1_13)
                {   // add outer end rings
                    rsq = hx * hx + hz * hz;
                    if ((int)rsq < 0)
                    {
                        out[j*w+i] = end_barrens;
                        continue;
                    }
                }
                uint16_t *p_elev = &hmap[(hz/2-z)*hw + (hx/2-x)];
                out[j*w+i] = getEndBiome(hx, hz, p_elev, hw);
            }
        }
    }

    free(hmap);
    return 0;
}